

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldStatePdu.cpp
# Opt level: O1

void __thiscall DIS::MinefieldStatePdu::~MinefieldStatePdu(MinefieldStatePdu *this)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pEVar3;
  pointer pEVar4;
  pointer pEVar5;
  pointer pVVar6;
  
  (this->super_MinefieldFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__MinefieldStatePdu_001b5440;
  pVVar1 = (this->_perimeterPoints).
           super__Vector_base<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (this->_perimeterPoints).
           super__Vector_base<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar6 = pVVar1;
  if (pVVar2 != pVVar1) {
    do {
      (**pVVar6->_vptr_Vector2Float)(pVVar6);
      pVVar6 = pVVar6 + 1;
    } while (pVVar6 != pVVar2);
    (this->_perimeterPoints).
    super__Vector_base<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  pEVar3 = (this->_mineType).super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (this->_mineType).super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pEVar5 = pEVar3;
  if (pEVar4 != pEVar3) {
    do {
      (**pEVar5->_vptr_EntityType)(pEVar5);
      pEVar5 = pEVar5 + 1;
    } while (pEVar5 != pEVar4);
    (this->_mineType).super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar3;
  }
  std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::~vector(&this->_mineType);
  std::vector<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>::~vector
            (&this->_perimeterPoints);
  EulerAngles::~EulerAngles(&this->_minefieldOrientation);
  Vector3Double::~Vector3Double(&this->_minefieldLocation);
  EntityType::~EntityType(&this->_minefieldType);
  MinefieldIdentifier::~MinefieldIdentifier(&this->_minefieldID);
  MinefieldFamilyPdu::~MinefieldFamilyPdu(&this->super_MinefieldFamilyPdu);
  return;
}

Assistant:

MinefieldStatePdu::~MinefieldStatePdu()
{
    _perimeterPoints.clear();
    _mineType.clear();
}